

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::tracker_alert::message_abi_cxx11_(string *__return_storage_ptr__,tracker_alert *this)

{
  char *__rhs;
  endpoint *ep;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  tracker_alert *local_18;
  tracker_alert *this_local;
  
  local_18 = this;
  this_local = (tracker_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_d8,&this->super_torrent_alert);
  std::operator+(&local_b8,&local_d8," (");
  __rhs = tracker_url(this);
  std::operator+(&local_98,&local_b8,__rhs);
  std::operator+(&local_78,&local_98,")");
  std::operator+(&local_58,&local_78,"[");
  print_endpoint_abi_cxx11_(&local_108,(libtorrent *)&this->local_endpoint,ep);
  std::operator+(&local_38,&local_58,&local_108);
  std::operator+(__return_storage_ptr__,&local_38,"]");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_alert::message() const
	{
		return torrent_alert::message() + " (" + tracker_url() + ")"
			+ "[" + print_endpoint(local_endpoint) + "]";
	}